

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS ref_search_tec(REF_SEARCH ref_search,char *filename)

{
  ulong uVar1;
  REF_DBL *pRVar2;
  FILE *__s;
  int iVar3;
  REF_STATUS RVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2b5,
           "ref_search_tec","unable to open file");
    RVar4 = 2;
  }
  else if (ref_search->d == 3) {
    fwrite("title=\"tecplot refine search\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"r\" \"i\"\n",0x20,1,__s);
    RVar4 = 0;
    fprintf(__s,"zone t=\"tree\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)ref_search->n,(ulong)(uint)(ref_search->n * 2),"point","felineseg");
    if (0 < ref_search->n) {
      lVar6 = 0;
      do {
        pRVar2 = ref_search->pos;
        lVar5 = (long)(int)lVar6 * (long)ref_search->d;
        fprintf(__s," %f %f %f %f %d\n",pRVar2[lVar5],pRVar2[lVar5 + 1],pRVar2[lVar5 + 2],
                ref_search->radius[lVar6],(ulong)(uint)ref_search->item[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < ref_search->n);
      if (0 < ref_search->n) {
        uVar7 = 0;
        do {
          iVar3 = (int)uVar7;
          if (ref_search->right[uVar7] != -1) {
            iVar3 = ref_search->right[uVar7];
          }
          uVar1 = uVar7 + 1;
          fprintf(__s," %d %d\n",uVar1 & 0xffffffff,(ulong)(iVar3 + 1));
          iVar3 = (int)uVar1 + -1;
          if (ref_search->left[uVar7] != -1) {
            iVar3 = ref_search->left[uVar7];
          }
          fprintf(__s," %d %d\n",uVar1 & 0xffffffff,(ulong)(iVar3 + 1));
          uVar7 = uVar1;
        } while ((long)uVar1 < (long)ref_search->n);
      }
    }
    fclose(__s);
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2b7,
           "ref_search_tec","limited to 3D");
    RVar4 = 1;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_search_tec(REF_SEARCH ref_search, const char *filename) {
  FILE *f;
  const char *zonetype = "felineseg";
  REF_INT i;
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  RAS(3 == ref_search->d, "limited to 3D");

  fprintf(f, "title=\"tecplot refine search\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"r\" \"i\"\n");

  fprintf(f,
          "zone t=\"tree\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          ref_search->n, 2 * (ref_search->n), "point", zonetype);

  for (i = 0; i < ref_search->n; i++) {
    fprintf(f, " %f %f %f %f %d\n", ref_search->pos[0 + ref_search->d * i],
            ref_search->pos[1 + ref_search->d * i],
            ref_search->pos[2 + ref_search->d * i], ref_search->radius[i],
            ref_search->item[i]);
  }

  for (i = 0; i < ref_search->n; i++) {
    REF_INT j;
    j = ref_search->right[i];
    if (REF_EMPTY == j) j = i;
    fprintf(f, " %d %d\n", i + 1, j + 1);
    j = ref_search->left[i];
    if (REF_EMPTY == j) j = i;
    fprintf(f, " %d %d\n", i + 1, j + 1);
  }

  fclose(f);
  return REF_SUCCESS;
}